

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ostream *this;
  long k;
  long dim;
  long firstSequenceLength;
  long sequence_copies;
  long sequences_read;
  Vector copy_count;
  double *freq_counts;
  char fasta_result;
  char automatonState;
  args_t args;
  bool in_stack_000001bf;
  double in_stack_000001c0;
  bool in_stack_000001cf;
  Vector *in_stack_000001d0;
  Vector *in_stack_000001d8;
  StringBuffer *in_stack_000001e0;
  StringBuffer *in_stack_000001e8;
  char *in_stack_000001f0;
  FILE *in_stack_000001f8;
  long *in_stack_00000210;
  Vector *in_stack_00000220;
  char in_stack_00000228;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  long in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffeec;
  args_t *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  ostream *in_stack_ffffffffffffff00;
  ostream *in_stack_ffffffffffffff08;
  StringBuffer *in_stack_ffffffffffffff10;
  ostream *in_stack_ffffffffffffff18;
  StringBuffer *in_stack_ffffffffffffff20;
  long local_90;
  long local_70;
  long local_68;
  Vector local_60;
  void *local_48;
  char local_3e;
  undefined1 local_3d;
  int local_1c;
  byte local_17;
  int local_4;
  
  local_4 = 0;
  argparse::args_t::args_t
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             (char **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  initAlphabets(SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0),in_stack_fffffffffffffef8,
                SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
  local_3d = 0;
  local_3e = '\x02';
  local_48 = (void *)0x0;
  Vector::Vector((Vector *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Vector::appendValue((Vector *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffed8);
  local_68 = 0;
  local_70 = 0;
  do {
    if (local_3e != '\x02') {
      if ((local_17 & 1) == 0) {
        in_stack_ffffffffffffff20 =
             (StringBuffer *)
             std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
        in_stack_ffffffffffffff18 =
             std::operator<<((ostream *)in_stack_ffffffffffffff20,"{\"unique\" : ");
        in_stack_ffffffffffffff10 =
             (StringBuffer *)std::ostream::operator<<(in_stack_ffffffffffffff18,local_68);
        in_stack_ffffffffffffff08 =
             std::operator<<((ostream *)in_stack_ffffffffffffff10," , \"total\" : ");
        in_stack_ffffffffffffff00 =
             (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff08,local_70);
        this = std::operator<<(in_stack_ffffffffffffff00,"}");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      exportJSON((FILE *)in_stack_ffffffffffffff20,(long)in_stack_ffffffffffffff18,
                 (long)in_stack_ffffffffffffff10,(double *)in_stack_ffffffffffffff08,
                 SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
      if ((local_48 != (void *)0x0) && (local_48 != (void *)0x0)) {
        operator_delete__(local_48);
      }
      local_4 = 0;
LAB_00104090:
      Vector::~Vector((Vector *)0x10409d);
      argparse::args_t::~args_t
                ((args_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      return local_4;
    }
    in_stack_fffffffffffffed0 = 1;
    iVar1 = readFASTA(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
                      in_stack_000001d8,in_stack_000001d0,in_stack_00000210,in_stack_000001cf,
                      in_stack_00000220,in_stack_00000228,in_stack_000001c0,in_stack_000001bf);
    local_3e = (char)iVar1;
    if (local_3e == '\x01') {
      local_4 = 1;
      goto LAB_00104090;
    }
    if (local_68 == 0) {
      uVar2 = SUB168(ZEXT816(0) * ZEXT816(8),0);
      if (SUB168(ZEXT816(0) * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_48 = operator_new__(uVar2);
      for (local_90 = 0; local_90 < 0; local_90 = local_90 + 1) {
        *(undefined8 *)((long)local_48 + local_90 * 8) = 0;
      }
    }
    if (local_1c == 1) {
      Vector::value(&local_60,0);
      handle_a_sequence_aa
                (in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff18,
                 (long)in_stack_ffffffffffffff10,(long)in_stack_ffffffffffffff08,
                 SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
    }
    else {
      Vector::value(&local_60,0);
      handle_a_sequence(in_stack_ffffffffffffff10,(double *)in_stack_ffffffffffffff08,
                        (long)in_stack_ffffffffffffff00,(long)in_stack_fffffffffffffef8,
                        SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
    }
    local_68 = local_68 + 1;
    lVar3 = Vector::value(&local_60,0);
    local_70 = lVar3 + local_70;
  } while( true );
}

Assistant:

int main (int argc, const char * argv[]) {

    args_t args = args_t (argc, argv);
    initAlphabets(args.data == protein);

    char automatonState = 0,
         fasta_result = 2;
    // 0 - between sequences
    // 1 - reading sequence name
    // 2 - reading sequence
    
    double * freq_counts = NULL;
    Vector copy_count;
    copy_count.appendValue(0);

 
    long sequences_read = 0L,
         sequence_copies = 0L,
         firstSequenceLength = 0L,
         dim = (args.data == dna) ? 4L: 20L;
          
    while (fasta_result == 2) {
        
        fasta_result = readFASTA (args.input, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength, true, &copy_count, args.counts_in_name);
        if (fasta_result == 1) {
            return 1;
        }
        if (sequences_read == 0) {
            freq_counts = new double [dim*firstSequenceLength];
            for (long k = 0; k < dim*firstSequenceLength; k++) freq_counts [k] = 0.;
        }
        
        if (args.data == protein) 
          handle_a_sequence_aa (sequences, freq_counts, firstSequenceLength, copy_count.value(0), args.ambig == skipover);
        else
          handle_a_sequence (sequences, freq_counts, firstSequenceLength, copy_count.value(0), args.ambig == skipover);
        sequences_read ++;
        sequence_copies += copy_count.value(0);
        /*if (args.quiet == false && sequences_read % 1000 == 0) {
            cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b" << setw(8) << sequences_read << " reads";
        }*/

    }
  
    if (args.quiet == false) {
      cerr << endl << "{\"unique\" : " << sequences_read << " , \"total\" : " << sequence_copies << "}" << endl;
    }
    
    /*if (args.quiet == false) {
      cerr << endl;
    }*/
    
    exportJSON (args.output, firstSequenceLength, dim, freq_counts, args.data == protein);
    if (freq_counts) delete [] freq_counts;
    
    return 0;

}